

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  void *pvVar7;
  float *pfVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  void *pvVar13;
  void *pvVar14;
  int iVar15;
  Mat rgb_channels;
  Mat local_70;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    else if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar2 = 0;
      iVar15 = 0;
      if (0 < h) {
        iVar15 = h;
      }
      iVar3 = 1;
      if (stride - w == 0) {
        iVar15 = 1;
        iVar3 = h;
      }
      pbVar12 = pixels;
      for (; iVar10 = iVar3 * w, iVar2 != iVar15; iVar2 = iVar2 + 1) {
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          *pfVar1 = (float)*pbVar12;
          pbVar12 = pbVar12 + 1;
          pfVar1 = pfVar1 + 1;
        }
        pbVar12 = pbVar12 + (stride - w);
      }
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if (pfVar1 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar15 = 0;
    if (0 < h) {
      iVar15 = h;
    }
    iVar2 = stride + w * -4;
    if (iVar2 != 0) {
      h = 1;
    }
    rgb_channels.w = __return_storage_ptr__->w;
    rgb_channels.h = __return_storage_ptr__->h;
    rgb_channels.elemsize = __return_storage_ptr__->elemsize;
    rgb_channels.refcount = (int *)0x0;
    rgb_channels.elempack = __return_storage_ptr__->elempack;
    rgb_channels.allocator = __return_storage_ptr__->allocator;
    rgb_channels.dims = 2;
    rgb_channels.c = 1;
    rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
    rgb_channels.data = pfVar1;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar6 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    pfVar5 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,3);
    pfVar8 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar15 = 1;
    }
    for (iVar3 = 0; iVar10 = h * w, iVar3 != iVar15; iVar3 = iVar3 + 1) {
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        *pfVar1 = (float)*pixels;
        *pfVar6 = (float)pixels[1];
        *pfVar5 = (float)pixels[2];
        *pfVar8 = (float)pixels[3];
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar6 = pfVar6 + 1;
        pfVar5 = pfVar5 + 1;
        pfVar8 = pfVar8 + 1;
      }
      pixels = pixels + iVar2;
    }
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x10002:
switchD_00128e29_caseD_20001:
    from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  case 0x10003:
switchD_00128e29_caseD_20003:
    from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  case 0x10004:
switchD_00128e29_caseD_20005:
    create(__return_storage_ptr__,w,h,3,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if (pfVar1 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar15 = 0;
    if (0 < h) {
      iVar15 = h;
    }
    iVar2 = stride + w * -4;
    if (iVar2 != 0) {
      h = 1;
    }
    rgb_channels.w = __return_storage_ptr__->w;
    rgb_channels.h = __return_storage_ptr__->h;
    rgb_channels.elemsize = __return_storage_ptr__->elemsize;
    rgb_channels.refcount = (int *)0x0;
    rgb_channels.elempack = __return_storage_ptr__->elempack;
    rgb_channels.allocator = __return_storage_ptr__->allocator;
    rgb_channels.dims = 2;
    rgb_channels.c = 1;
    rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
    rgb_channels.data = pfVar1;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar6 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    pfVar5 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar15 = 1;
    }
    for (iVar3 = 0; iVar10 = h * w, iVar3 != iVar15; iVar3 = iVar3 + 1) {
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        *pfVar1 = (float)*pixels;
        *pfVar6 = (float)pixels[1];
        *pfVar5 = (float)pixels[2];
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar6 = pfVar6 + 1;
        pfVar5 = pfVar5 + 1;
      }
      pixels = pixels + iVar2;
    }
    return __return_storage_ptr__;
  case 0x10005:
switchD_00128e29_caseD_20004:
    create(__return_storage_ptr__,w,h,3,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if (pfVar1 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar15 = 0;
    if (0 < h) {
      iVar15 = h;
    }
    iVar2 = stride + w * -4;
    if (iVar2 != 0) {
      h = 1;
    }
    rgb_channels.w = __return_storage_ptr__->w;
    rgb_channels.h = __return_storage_ptr__->h;
    rgb_channels.elemsize = __return_storage_ptr__->elemsize;
    rgb_channels.refcount = (int *)0x0;
    rgb_channels.elempack = __return_storage_ptr__->elempack;
    rgb_channels.allocator = __return_storage_ptr__->allocator;
    rgb_channels.dims = 2;
    rgb_channels.c = 1;
    rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
    rgb_channels.data = pfVar1;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar6 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    pfVar5 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar15 = 1;
    }
    for (iVar3 = 0; iVar10 = h * w, iVar3 != iVar15; iVar3 = iVar3 + 1) {
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        *pfVar1 = (float)pixels[2];
        *pfVar6 = (float)pixels[1];
        *pfVar5 = (float)*pixels;
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar6 = pfVar6 + 1;
        pfVar5 = pfVar5 + 1;
      }
      pixels = pixels + iVar2;
    }
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x20001:
    goto switchD_00128e29_caseD_20001;
  case 0x20002:
    return __return_storage_ptr__;
  case 0x20003:
    goto switchD_00128e29_caseD_20003;
  case 0x20004:
    goto switchD_00128e29_caseD_20004;
  case 0x20005:
    goto switchD_00128e29_caseD_20005;
  default:
    switch(type) {
    case 0x30001:
      iVar15 = 1;
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = w * -3 + stride;
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      if (iVar10 == 0) {
        iVar2 = iVar15;
        iVar15 = h;
      }
      for (; iVar11 = iVar15 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar11; iVar11 = iVar11 + -1) {
          *pfVar1 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                           >> 8);
          pixels = pixels + 3;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar10;
      }
      return __return_storage_ptr__;
    case 0x30002:
      iVar15 = 1;
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar10 = w * -3 + stride;
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      if (iVar10 == 0) {
        iVar2 = iVar15;
        iVar15 = h;
      }
      for (; iVar11 = iVar15 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar11; iVar11 = iVar11 + -1) {
          *pfVar1 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                           >> 8);
          pixels = pixels + 3;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar10;
      }
      return __return_storage_ptr__;
    case 0x30003:
      return __return_storage_ptr__;
    case 0x30004:
      iVar15 = 1;
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      iVar10 = stride + w * -4;
      if (iVar10 == 0) {
        iVar2 = iVar15;
        iVar15 = h;
      }
      for (; iVar11 = iVar15 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar11; iVar11 = iVar11 + -1) {
          *pfVar1 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                           >> 8);
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar10;
      }
      return __return_storage_ptr__;
    case 0x30005:
      iVar15 = 1;
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      iVar10 = stride + w * -4;
      if (iVar10 == 0) {
        iVar2 = iVar15;
        iVar15 = h;
      }
      for (; iVar11 = iVar15 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar11; iVar11 = iVar11 + -1) {
          *pfVar1 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                           >> 8);
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar10;
      }
      return __return_storage_ptr__;
    }
  }
  switch(type) {
  case 0x40001:
switchD_00128bbd_caseD_50002:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    if (__return_storage_ptr__->data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    channel_range(&rgb_channels,__return_storage_ptr__,0,3);
    from_rgb(pixels,w,h,stride,&rgb_channels,allocator);
    channel(&local_70,__return_storage_ptr__,3);
    break;
  case 0x40002:
switchD_00128bbd_caseD_50001:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    if (__return_storage_ptr__->data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    channel_range(&rgb_channels,__return_storage_ptr__,0,3);
    from_rgb2bgr(pixels,w,h,stride,&rgb_channels,allocator);
    channel(&local_70,__return_storage_ptr__,3);
    break;
  case 0x40003:
switchD_00128bbd_caseD_50003:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    if (__return_storage_ptr__->data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    channel_range(&rgb_channels,__return_storage_ptr__,0,3);
    from_gray2rgb(pixels,w,h,stride,&rgb_channels,allocator);
    channel(&local_70,__return_storage_ptr__,3);
    break;
  case 0x40004:
    return __return_storage_ptr__;
  case 0x40005:
switchD_00128bbd_caseD_50004:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pvVar14 = __return_storage_ptr__->data;
    if (pvVar14 == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar15 = 0;
    if (0 < h) {
      iVar15 = h;
    }
    iVar2 = stride + w * -4;
    if (iVar2 != 0) {
      h = 1;
    }
    rgb_channels.w = __return_storage_ptr__->w;
    rgb_channels.h = __return_storage_ptr__->h;
    rgb_channels.elemsize = __return_storage_ptr__->elemsize;
    rgb_channels.refcount = (int *)0x0;
    rgb_channels.elempack = __return_storage_ptr__->elempack;
    rgb_channels.allocator = __return_storage_ptr__->allocator;
    rgb_channels.dims = 2;
    rgb_channels.c = 1;
    rgb_channels.cstep = (size_t)(rgb_channels.h * rgb_channels.w);
    rgb_channels.data = pvVar14;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pvVar13 = rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    pvVar7 = rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,3);
    pvVar9 = rgb_channels.data;
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar15 = 1;
    }
    for (iVar3 = 0; iVar3 != iVar15; iVar3 = iVar3 + 1) {
      lVar4 = 0;
      for (iVar10 = h * w; 0 < iVar10; iVar10 = iVar10 + -1) {
        *(float *)((long)pvVar14 + lVar4) = (float)pixels[lVar4 + 2];
        *(float *)((long)pvVar13 + lVar4) = (float)pixels[lVar4 + 1];
        *(float *)((long)pvVar7 + lVar4) = (float)pixels[lVar4];
        *(float *)((long)pvVar9 + lVar4) = (float)pixels[lVar4 + 3];
        lVar4 = lVar4 + 4;
      }
      pixels = pixels + lVar4 + iVar2;
      pvVar14 = (void *)((long)pvVar14 + lVar4);
      pvVar13 = (void *)((long)pvVar13 + lVar4);
      pvVar7 = (void *)((long)pvVar7 + lVar4);
      pvVar9 = (void *)((long)pvVar9 + lVar4);
    }
    return __return_storage_ptr__;
  default:
    switch(type) {
    case 0x50001:
      goto switchD_00128bbd_caseD_50001;
    case 0x50002:
      goto switchD_00128bbd_caseD_50002;
    case 0x50003:
      goto switchD_00128bbd_caseD_50003;
    case 0x50004:
      goto switchD_00128bbd_caseD_50004;
    default:
      return __return_storage_ptr__;
    }
  }
  fill(&local_70,255.0);
  ~Mat(&local_70);
  ~Mat(&rgb_channels);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}